

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O3

void Qentem::Memory::Sort<true,Qentem::Value<char>,unsigned_int>
               (Value<char> *arr,uint start,uint end)

{
  Value<char> *val;
  Value<char> *val_00;
  ValueType VVar1;
  ValueType VVar2;
  char cVar3;
  char cVar4;
  Value<char> *pVVar5;
  Value<char> *pVVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  Value<char> local_48;
  
  if (start != end) {
    uVar9 = start;
    if (start + 1 < end) {
      uVar11 = (ulong)(start + 1);
      uVar10 = (ulong)start;
      val = arr + start;
      do {
        val_00 = arr + uVar11;
        pVVar5 = val;
        pVVar6 = val_00;
        while( true ) {
          VVar1 = pVVar5->type_;
          for (; VVar2 = pVVar6->type_, VVar2 != VVar1; pVVar6 = (pVVar6->field_0).array_.storage_)
          {
            if (VVar2 != ValuePtr) {
              if (VVar1 <= VVar2) goto switchD_0013243c_default;
              goto LAB_001323be;
            }
          }
          if (VVar1 != ValuePtr) break;
          pVVar6 = (pVVar6->field_0).array_.storage_;
          pVVar5 = (pVVar5->field_0).array_.storage_;
        }
        switch(VVar1) {
        case Object:
        case Array:
          if ((pVVar6->field_0).array_.index_ < (pVVar5->field_0).array_.index_) {
LAB_001323be:
            uVar10 = (ulong)((int)uVar10 + 1);
            Value<char>::Value(&local_48,arr + uVar10);
            Value<char>::operator=(arr + uVar10,val_00);
            Value<char>::operator=(val_00,&local_48);
            Value<char>::~Value(&local_48);
          }
          break;
        case String:
          uVar9 = (pVVar6->field_0).array_.index_;
          uVar7 = (pVVar5->field_0).array_.index_;
          if (uVar9 < uVar7) {
            uVar7 = uVar9;
          }
          if (uVar7 != 0) {
            uVar8 = 0;
            do {
              cVar3 = *(char *)((long)&((pVVar5->field_0).array_.storage_)->field_0 + uVar8);
              cVar4 = *(char *)((long)&((pVVar6->field_0).array_.storage_)->field_0 + uVar8);
              if (cVar3 < cVar4) break;
              if (cVar4 < cVar3) goto LAB_001323be;
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
          break;
        case UIntLong:
          if ((pVVar6->field_0).array_.storage_ < (pVVar5->field_0).array_.storage_)
          goto LAB_001323be;
          break;
        case IntLong:
          if ((long)(pVVar6->field_0).array_.storage_ < (long)(pVVar5->field_0).array_.storage_)
          goto LAB_001323be;
          break;
        case Double:
          if (*(double *)&pVVar6->field_0 < *(double *)&pVVar5->field_0) goto LAB_001323be;
        }
switchD_0013243c_default:
        uVar9 = (uint)uVar10;
        uVar11 = uVar11 + 1;
      } while ((uint)uVar11 != end);
      if (uVar9 != start) {
        Value<char>::Value(&local_48,arr + uVar10);
        Value<char>::operator=(arr + uVar10,val);
        Value<char>::operator=(val,&local_48);
        Value<char>::~Value(&local_48);
      }
    }
    Sort<true,Qentem::Value<char>,unsigned_int>(arr,start,uVar9);
    Sort<true,Qentem::Value<char>,unsigned_int>(arr,uVar9 + 1,end);
  }
  return;
}

Assistant:

inline static void Sort(Type_T *arr, Number_T start, Number_T end) noexcept {
    if (start != end) {
        Type_T  &item   = arr[start];
        Number_T index  = start;
        Number_T offset = (start + Number_T{1});

        while (offset < end) {
            if (Ascend_T) {
                if (arr[offset] < item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            } else {
                if (arr[offset] > item) {
                    ++index;
                    Swap(arr[index], arr[offset]);
                }
            }

            ++offset;
        }

        if (index != start) {
            Swap(arr[index], arr[start]);
        }

        Sort<Ascend_T>(arr, start, index);
        ++index;
        Sort<Ascend_T>(arr, index, end);
    }
}